

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

vector<cv::Mat,_std::allocator<cv::Mat>_> *
get_test_src(vector<cv::Mat,_std::allocator<cv::Mat>_> *__return_storage_ptr__,string *where)

{
  DIR *__dirp;
  dirent *pdVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [96];
  
  (__return_storage_ptr__->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __dirp = opendir((where->_M_dataplus)._M_p);
  while( true ) {
    pdVar1 = readdir(__dirp);
    if (pdVar1 == (dirent *)0x0) break;
    if (pdVar1->d_name[0] != '.') {
      std::operator+(&local_d0,where,'/');
      std::operator+(&local_b0,&local_d0,pdVar1->d_name);
      cv::imread(local_90,(int)&local_b0);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::emplace_back<cv::Mat>
                (__return_storage_ptr__,(Mat *)local_90);
      cv::Mat::~Mat((Mat *)local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cv::Mat> get_test_src(const std::string& where)
{
	std::vector<cv::Mat> ret;
	DIR* dir_ptr = opendir(where.c_str());
	dirent* dptr;
	while((dptr = readdir(dir_ptr)) != NULL)
	{
		if(dptr->d_name[0] == '.')
			continue;
		ret.push_back(cv::imread(where+'/'+dptr->d_name, cv::IMREAD_GRAYSCALE));
	}
	return ret;
}